

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int IsLosslessBlendingPossible(WebPPicture *src,WebPPicture *dst,FrameRectangle *rect)

{
  uint32_t dst_alpha;
  uint32_t dst_pixel;
  uint32_t src_pixel;
  int j;
  int i;
  FrameRectangle *rect_local;
  WebPPicture *dst_local;
  WebPPicture *src_local;
  
  j = rect->y_offset_;
  do {
    if (rect->y_offset_ + rect->height_ <= j) {
      return 1;
    }
    for (i = rect->x_offset_; i < rect->x_offset_ + rect->width_; i = i + 1) {
      if ((dst->argb[j * dst->argb_stride + i] >> 0x18 != 0xff) &&
         (src->argb[j * src->argb_stride + i] != dst->argb[j * dst->argb_stride + i])) {
        return 0;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

static int IsLosslessBlendingPossible(const WebPPicture* const src,
                                      const WebPPicture* const dst,
                                      const FrameRectangle* const rect) {
  int i, j;
  assert(src->width == dst->width && src->height == dst->height);
  assert(rect->x_offset_ + rect->width_ <= dst->width);
  assert(rect->y_offset_ + rect->height_ <= dst->height);
  for (j = rect->y_offset_; j < rect->y_offset_ + rect->height_; ++j) {
    for (i = rect->x_offset_; i < rect->x_offset_ + rect->width_; ++i) {
      const uint32_t src_pixel = src->argb[j * src->argb_stride + i];
      const uint32_t dst_pixel = dst->argb[j * dst->argb_stride + i];
      const uint32_t dst_alpha = dst_pixel >> 24;
      if (dst_alpha != 0xff && src_pixel != dst_pixel) {
        // In this case, if we use blending, we can't attain the desired
        // 'dst_pixel' value for this pixel. So, blending is not possible.
        return 0;
      }
    }
  }
  return 1;
}